

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
re2::StringPiece::operator_cast_to_string(StringPiece *this)

{
  char *pcVar1;
  ulong uVar2;
  long *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator local_11 [17];
  
  if (*in_RSI == 0) {
    std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    pcVar1 = (char *)*in_RSI;
    uVar2 = in_RSI[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar1,uVar2,local_11);
    std::allocator<char>::~allocator((allocator<char> *)local_11);
  }
  return in_RDI;
}

Assistant:

explicit operator std::basic_string<char, traits_type, A>() const {
    if (!data_) return {};
    return std::basic_string<char, traits_type, A>(data_, size_);
  }